

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableHeader(char *label)

{
  ImVec2 *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImGuiTable *pIVar4;
  ImDrawList *draw_list;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiID id;
  ImU32 IVar7;
  ImGuiSortDirection sort_direction;
  ImGuiTableColumn *pIVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  ImGuiTableColumn *column;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  ulong uVar16;
  ImVec2 pos;
  ImVec2 pos_00;
  undefined1 auVar17 [16];
  bool held;
  bool hovered;
  char sort_order_suf [4];
  ImVec2 label_pos;
  ImVec2 label_size;
  ImRect bb;
  bool local_10a;
  bool local_109;
  ImGuiWindow *local_108;
  char local_fc [4];
  undefined1 local_f8 [16];
  char *local_e0;
  undefined1 local_d8 [16];
  ImVec2 local_c0;
  ImVec2 local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  char *local_88;
  ImVec2 local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ImRect local_58;
  undefined1 local_48 [16];
  undefined8 extraout_XMM0_Qb;
  
  pIVar5 = GImGui;
  local_108 = GImGui->CurrentWindow;
  if (local_108->SkipItems == false) {
    pIVar4 = GImGui->CurrentTable;
    iVar9 = pIVar4->CurrentColumn;
    lVar11 = (long)iVar9;
    column = (pIVar4->Columns).Data + lVar11;
    pcVar10 = "";
    if (label != (char *)0x0) {
      pcVar10 = label;
    }
    local_88 = FindRenderedTextEnd(pcVar10,(char *)0x0);
    local_b8 = CalcTextSize(pcVar10,local_88,true,-1.0);
    local_c0 = (local_108->DC).CursorPos;
    pIVar8 = (pIVar4->Columns).Data;
    fVar15 = pIVar8[lVar11].MinX;
    if (pIVar8[lVar11].PrevEnabledColumn == -1) {
      fVar15 = fVar15 - pIVar4->CellSpacingX1;
    }
    local_f8 = ZEXT416((uint)fVar15);
    fVar15 = pIVar8[lVar11].MaxX;
    if (pIVar8[lVar11].NextEnabledColumn == -1) {
      fVar15 = fVar15 + pIVar4->CellSpacingX2;
    }
    local_d8 = ZEXT416((uint)fVar15);
    local_a8._0_4_ = pIVar4->RowPosY1;
    local_48 = ZEXT416((uint)pIVar4->RowPosY2);
    fVar15 = pIVar4->RowMinHeight - (pIVar4->CellPaddingY + pIVar4->CellPaddingY);
    uVar13 = -(uint)(fVar15 <= local_b8.y);
    local_68 = ZEXT416(uVar13 & (uint)local_b8.y | ~uVar13 & (uint)fVar15);
    local_fc[0] = '\0';
    local_fc[1] = '\0';
    local_fc[2] = '\0';
    local_fc[3] = '\0';
    local_78 = ZEXT816(0);
    if (((pIVar4->Flags & 8) == 0) || ((column->Flags & 0x100) != 0)) {
      local_98._0_4_ = 0.0;
      local_98._4_4_ = 0;
      local_98._8_4_ = 0;
      local_98._12_4_ = 0;
    }
    else {
      local_98._0_4_ = (undefined4)(int)(pIVar5->FontSize * 0.65 + (pIVar5->Style).FramePadding.x);
      local_98._4_4_ = 0;
      local_98._8_4_ = 0;
      local_98._12_4_ = 0;
      if ('\0' < column->SortOrder) {
        local_98 = ZEXT416((uint)local_98._0_4_);
        ImFormatString(local_fc,4,"%d",(ulong)((byte)column->SortOrder + 1));
        local_e0 = (char *)CONCAT44(local_e0._4_4_,(pIVar5->Style).ItemInnerSpacing.x);
        auVar17._0_8_ = CalcTextSize(local_fc,(char *)0x0,false,-1.0);
        auVar17._8_8_ = extraout_XMM0_Qb;
        local_78._4_12_ = auVar17._4_12_;
        local_78._0_4_ = auVar17._0_4_ + local_e0._0_4_;
      }
    }
    fVar15 = local_c0.x + local_b8.x + local_78._0_4_ + (float)local_98._0_4_;
    uVar2 = column->ContentMaxXHeadersUsed;
    uVar3 = column->ContentMaxXHeadersIdeal;
    uVar13 = -(uint)(column->WorkMaxX <= (float)uVar2);
    uVar14 = -(uint)(fVar15 <= (float)uVar3);
    uVar16 = CONCAT44(~uVar14 & (uint)fVar15,~uVar13 & (uint)column->WorkMaxX) |
             CONCAT44(uVar3 & uVar14,uVar2 & uVar13);
    column->ContentMaxXHeadersUsed = (float)(int)uVar16;
    column->ContentMaxXHeadersIdeal = (float)(int)(uVar16 >> 0x20);
    if ((pIVar4->IsContextPopupOpen == true) && (iVar9 == pIVar4->ContextPopupColumn)) {
      bVar12 = pIVar4->InstanceInteracted == pIVar4->InstanceCurrent;
    }
    else {
      bVar12 = false;
    }
    local_e0 = pcVar10;
    local_b0 = lVar11;
    id = ImGuiWindow::GetID(local_108,pcVar10,(char *)0x0);
    fVar15 = (pIVar5->Style).CellPadding.y;
    fVar15 = fVar15 + fVar15 + (float)local_68._0_4_ + (float)local_a8._0_4_;
    uVar13 = -(uint)(fVar15 <= (float)local_48._0_4_);
    local_58.Max.y = (float)(uVar13 & local_48._0_4_ | ~uVar13 & (uint)fVar15);
    local_58.Min.x = (float)local_f8._0_4_;
    local_58.Min.y = (float)local_a8._0_4_;
    local_58.Max.x = (float)local_d8._0_4_;
    local_80.x = 0.0;
    local_80.y = (float)local_68._0_4_;
    ItemSize(&local_80,-1.0);
    bVar6 = ItemAdd(&local_58,id,(ImRect *)0x0);
    if (bVar6) {
      bVar6 = ButtonBehavior(&local_58,id,&local_109,&local_10a,0x1000);
      if (pIVar5->ActiveId != id) {
        SetItemAllowOverlap();
      }
      if (((local_10a | local_109) & 1U) == 0 && !bVar12) {
        iVar9 = (int)local_b0;
        if ((pIVar4->field_0x90 & 1) == 0) {
          IVar7 = GetColorU32(0x2a,1.0);
          TableSetBgColor(3,IVar7,pIVar4->CurrentColumn);
        }
      }
      else {
        uVar13 = 0x1a;
        if (local_10a == false) {
          uVar13 = local_109 & 1 | 0x18;
        }
        IVar7 = GetColorU32(uVar13,1.0);
        TableSetBgColor(3,IVar7,pIVar4->CurrentColumn);
        RenderNavHighlight(&local_58,id,10);
        iVar9 = (int)local_b0;
      }
      if (local_10a == true) {
        pIVar4->HeldHeaderColumn = (ImGuiTableColumnIdx)iVar9;
        (local_108->DC).CursorPos.y =
             (pIVar5->Style).ItemSpacing.y * -0.5 + (local_108->DC).CursorPos.y;
        if ((pIVar4->Flags & 2) != 0) {
          bVar12 = IsMouseDragging(0,-1.0);
          if ((bVar12) && (pIVar5->DragDropActive == false)) {
            pIVar4->ReorderColumn = (ImGuiTableColumnIdx)iVar9;
            pIVar4->InstanceInteracted = pIVar4->InstanceCurrent;
            fVar15 = (pIVar5->IO).MouseDelta.x;
            if ((fVar15 < 0.0) &&
               (pIVar1 = &(pIVar5->IO).MousePos,
               pIVar1->x <= (float)local_f8._0_4_ && (float)local_f8._0_4_ != pIVar1->x)) {
              if ((long)column->PrevEnabledColumn == -1) {
                pIVar8 = (ImGuiTableColumn *)0x0;
              }
              else {
                pIVar8 = (pIVar4->Columns).Data + column->PrevEnabledColumn;
              }
              if (((pIVar8 != (ImGuiTableColumn *)0x0) &&
                  (((pIVar8->Flags | column->Flags) & 0x20U) == 0)) &&
                 (column->IndexWithinEnabledSet < pIVar4->FreezeColumnsRequest !=
                  pIVar4->FreezeColumnsRequest <= pIVar8->IndexWithinEnabledSet)) {
                pIVar4->ReorderColumnDir = -1;
              }
            }
            if ((0.0 < fVar15) && ((float)local_d8._0_4_ < (pIVar5->IO).MousePos.x)) {
              if ((long)column->NextEnabledColumn == -1) {
                pIVar8 = (ImGuiTableColumn *)0x0;
              }
              else {
                pIVar8 = (pIVar4->Columns).Data + column->NextEnabledColumn;
              }
              if (((pIVar8 != (ImGuiTableColumn *)0x0) &&
                  (((pIVar8->Flags | column->Flags) & 0x20U) == 0)) &&
                 (column->IndexWithinEnabledSet < pIVar4->FreezeColumnsRequest !=
                  pIVar4->FreezeColumnsRequest <= pIVar8->IndexWithinEnabledSet)) {
                pIVar4->ReorderColumnDir = '\x01';
              }
            }
          }
        }
      }
      else {
        (local_108->DC).CursorPos.y =
             (pIVar5->Style).ItemSpacing.y * -0.5 + (local_108->DC).CursorPos.y;
      }
      local_d8._0_4_ = ((float)local_d8._0_4_ - (float)local_98._0_4_) - (float)local_78._0_4_;
      fVar15 = (float)local_d8._0_4_;
      if (((pIVar4->Flags & 8) != 0) && ((column->Flags & 0x100) == 0)) {
        if (column->SortOrder != -1) {
          local_a8 = ZEXT416((uint)local_c0.y);
          local_f8._4_4_ = local_f8._4_4_ & local_d8._4_4_;
          local_f8._0_4_ =
               ~-(uint)((float)local_d8._0_4_ <= (float)local_f8._0_4_) & local_d8._0_4_ |
               local_f8._0_4_ & -(uint)((float)local_d8._0_4_ <= (float)local_f8._0_4_);
          local_f8._8_4_ = local_f8._8_4_ & local_d8._8_4_;
          local_f8._12_4_ = local_f8._12_4_ & local_d8._12_4_;
          if ('\0' < column->SortOrder) {
            IVar7 = GetColorU32(0,0.7);
            PushStyleColor(0,IVar7);
            pos.x = (pIVar5->Style).ItemInnerSpacing.x + (float)local_f8._0_4_;
            pos.y = (float)local_a8._0_4_;
            RenderText(pos,local_fc,(char *)0x0,true);
            PopStyleColor(1);
            local_f8._0_4_ = (float)local_f8._0_4_ + (float)local_78._0_4_;
          }
          draw_list = local_108->DrawList;
          IVar7 = GetColorU32(0,1.0);
          pos_00.y = (float)local_a8._0_4_;
          pos_00.x = (float)local_f8._0_4_;
          RenderArrow(draw_list,pos_00,IVar7,(column->field_0x64 & 3) == 1 ^ 3,0.65);
          fVar15 = (float)local_d8._0_4_;
        }
        if ((bVar6) && (iVar9 != pIVar4->ReorderColumn)) {
          sort_direction = TableGetColumnNextSortDirection(column);
          TableSetColumnSortDirection(iVar9,sort_direction,(pIVar5->IO).KeyShift);
          fVar15 = (float)local_d8._0_4_;
        }
      }
      pcVar10 = local_88;
      local_80.y = local_c0.y + (float)local_68._0_4_ + (pIVar5->Style).FramePadding.y;
      local_80.x = fVar15;
      RenderTextEllipsis(local_108->DrawList,&local_c0,&local_80,fVar15,fVar15,local_e0,local_88,
                         &local_b8);
      if ((((float)local_d8._0_4_ - local_c0.x < local_b8.x) && (local_109 == true)) &&
         (pIVar5->TooltipSlowDelay <= pIVar5->HoveredIdNotActiveTimer &&
          pIVar5->HoveredIdNotActiveTimer != pIVar5->TooltipSlowDelay)) {
        SetTooltip("%.*s",(ulong)(uint)((int)pcVar10 - (int)local_e0));
      }
      bVar12 = IsMouseReleased(1);
      if (bVar12) {
        bVar12 = IsItemHovered(0);
        if (bVar12) {
          TableOpenContextMenu(iVar9);
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableHeader(const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeader() after BeginTable()!");
    IM_ASSERT(table->CurrentColumn != -1);
    const int column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];

    // Label
    if (label == NULL)
        label = "";
    const char* label_end = FindRenderedTextEnd(label);
    ImVec2 label_size = CalcTextSize(label, label_end, true);
    ImVec2 label_pos = window->DC.CursorPos;

    // If we already got a row height, there's use that.
    // FIXME-TABLE: Padding problem if the correct outer-padding CellBgRect strays off our ClipRect?
    ImRect cell_r = TableGetCellBgRect(table, column_n);
    float label_height = ImMax(label_size.y, table->RowMinHeight - table->CellPaddingY * 2.0f);

    // Calculate ideal size for sort order arrow
    float w_arrow = 0.0f;
    float w_sort_text = 0.0f;
    char sort_order_suf[4] = "";
    const float ARROW_SCALE = 0.65f;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        w_arrow = ImFloor(g.FontSize * ARROW_SCALE + g.Style.FramePadding.x);
        if (column->SortOrder > 0)
        {
            ImFormatString(sort_order_suf, IM_ARRAYSIZE(sort_order_suf), "%d", column->SortOrder + 1);
            w_sort_text = g.Style.ItemInnerSpacing.x + CalcTextSize(sort_order_suf).x;
        }
    }

    // We feed our unclipped width to the column without writing on CursorMaxPos, so that column is still considering for merging.
    float max_pos_x = label_pos.x + label_size.x + w_sort_text + w_arrow;
    column->ContentMaxXHeadersUsed = ImMax(column->ContentMaxXHeadersUsed, column->WorkMaxX);
    column->ContentMaxXHeadersIdeal = ImMax(column->ContentMaxXHeadersIdeal, max_pos_x);

    // Keep header highlighted when context menu is open.
    const bool selected = (table->IsContextPopupOpen && table->ContextPopupColumn == column_n && table->InstanceInteracted == table->InstanceCurrent);
    ImGuiID id = window->GetID(label);
    ImRect bb(cell_r.Min.x, cell_r.Min.y, cell_r.Max.x, ImMax(cell_r.Max.y, cell_r.Min.y + label_height + g.Style.CellPadding.y * 2.0f));
    ItemSize(ImVec2(0.0f, label_height)); // Don't declare unclipped width, it'll be fed ContentMaxPosHeadersIdeal
    if (!ItemAdd(bb, id))
        return;

    //GetForegroundDrawList()->AddRect(cell_r.Min, cell_r.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]
    //GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]

    // Using AllowItemOverlap mode because we cover the whole cell, and we want user to be able to submit subsequent items.
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();
    if (held || hovered || selected)
    {
        const ImU32 col = GetColorU32(held ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        //RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        TableSetBgColor(ImGuiTableBgTarget_CellBg, col, table->CurrentColumn);
        RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    }
    else
    {
        // Submit single cell bg color in the case we didn't submit a full header row
        if ((table->RowFlags & ImGuiTableRowFlags_Headers) == 0)
            TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_TableHeaderBg), table->CurrentColumn);
    }
    if (held)
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)column_n;
    window->DC.CursorPos.y -= g.Style.ItemSpacing.y * 0.5f;

    // Drag and drop to re-order columns.
    // FIXME-TABLE: Scroll request while reordering a column and it lands out of the scrolling zone.
    if (held && (table->Flags & ImGuiTableFlags_Reorderable) && IsMouseDragging(0) && !g.DragDropActive)
    {
        // While moving a column it will jump on the other side of the mouse, so we also test for MouseDelta.x
        table->ReorderColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;

        // We don't reorder: through the frozen<>unfrozen line, or through a column that is marked with ImGuiTableColumnFlags_NoReorder.
        if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < cell_r.Min.x)
            if (ImGuiTableColumn* prev_column = (column->PrevEnabledColumn != -1) ? &table->Columns[column->PrevEnabledColumn] : NULL)
                if (!((column->Flags | prev_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (prev_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = -1;
        if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > cell_r.Max.x)
            if (ImGuiTableColumn* next_column = (column->NextEnabledColumn != -1) ? &table->Columns[column->NextEnabledColumn] : NULL)
                if (!((column->Flags | next_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (next_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = +1;
    }

    // Sort order arrow
    const float ellipsis_max = cell_r.Max.x - w_arrow - w_sort_text;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        if (column->SortOrder != -1)
        {
            float x = ImMax(cell_r.Min.x, cell_r.Max.x - w_arrow - w_sort_text);
            float y = label_pos.y;
            if (column->SortOrder > 0)
            {
                PushStyleColor(ImGuiCol_Text, GetColorU32(ImGuiCol_Text, 0.70f));
                RenderText(ImVec2(x + g.Style.ItemInnerSpacing.x, y), sort_order_suf);
                PopStyleColor();
                x += w_sort_text;
            }
            RenderArrow(window->DrawList, ImVec2(x, y), GetColorU32(ImGuiCol_Text), column->SortDirection == ImGuiSortDirection_Ascending ? ImGuiDir_Up : ImGuiDir_Down, ARROW_SCALE);
        }

        // Handle clicking on column header to adjust Sort Order
        if (pressed && table->ReorderColumn != column_n)
        {
            ImGuiSortDirection sort_direction = TableGetColumnNextSortDirection(column);
            TableSetColumnSortDirection(column_n, sort_direction, g.IO.KeyShift);
        }
    }

    // Render clipped label. Clipping here ensure that in the majority of situations, all our header cells will
    // be merged into a single draw call.
    //window->DrawList->AddCircleFilled(ImVec2(ellipsis_max, label_pos.y), 40, IM_COL32_WHITE);
    RenderTextEllipsis(window->DrawList, label_pos, ImVec2(ellipsis_max, label_pos.y + label_height + g.Style.FramePadding.y), ellipsis_max, ellipsis_max, label, label_end, &label_size);

    const bool text_clipped = label_size.x > (ellipsis_max - label_pos.x);
    if (text_clipped && hovered && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay)
        SetTooltip("%.*s", (int)(label_end - label), label);

    // We don't use BeginPopupContextItem() because we want the popup to stay up even after the column is hidden
    if (IsMouseReleased(1) && IsItemHovered())
        TableOpenContextMenu(column_n);
}